

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
OP_StLocalFunctionExpression<Js::OpLayoutT_ElementU<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementU<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  Var instance;
  Var value;
  
  instance = *(Var *)(this + 0x58);
  value = GetReg<unsigned_short>(this,playout->Instance);
  OP_StFunctionExpression(this,instance,value,(uint)playout->PropertyIdIndex);
  return;
}

Assistant:

void InterpreterStackFrame::OP_StLocalFunctionExpression(const unaligned T * playout)
    {
        OP_StFunctionExpression(this->localClosure, GetReg(playout->Instance), playout->PropertyIdIndex);
    }